

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFMatrix<long_double>::TPZFMatrix
          (TPZFMatrix<long_double> *this,initializer_list<long_double> *list)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  void *pvVar4;
  const_iterator plVar5;
  initializer_list<long_double> *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZVec<long_double> *this_00;
  longdouble *aux;
  const_iterator it_end;
  const_iterator it;
  int64_t in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  longdouble *plVar6;
  TPZManVector<int,_5> *in_stack_ffffffffffffffc0;
  const_iterator local_38;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZFMatrix<long_double>>(in_RDI,0x21);
  std::initializer_list<long_double>::size(in_RSI);
  TPZMatrix<long_double>::TPZMatrix
            ((TPZMatrix<long_double> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,(int64_t)in_RDI);
  *(undefined ***)in_RDI = &PTR__TPZFMatrix_023de940;
  TPZManVector<int,_5>::TPZManVector(in_stack_ffffffffffffffc0,(int64_t)in_stack_ffffffffffffffb8);
  this_00 = (TPZVec<long_double> *)(in_RDI + 0x70);
  TPZVec<long_double>::TPZVec(this_00);
  sVar2 = std::initializer_list<long_double>::size(in_RSI);
  if (sVar2 != 0) {
    sVar2 = std::initializer_list<long_double>::size(in_RSI);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *(void **)(in_RDI + 0x20) = pvVar4;
  }
  local_38 = std::initializer_list<long_double>::begin(in_RSI);
  plVar5 = std::initializer_list<long_double>::end((initializer_list<long_double> *)this_00);
  plVar6 = *(longdouble **)(in_RDI + 0x20);
  for (; local_38 != plVar5; local_38 = local_38 + 1) {
    *plVar6 = *local_38;
    plVar6 = plVar6 + 1;
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const std::initializer_list<TVar>& list) 
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId), TPZMatrix<TVar>(list.size(), 1)
{
	if (list.size() > 0) {
		this->fElem = new TVar[list.size()];
	}

	auto it = list.begin();
	auto it_end = list.end();
	TVar* aux = fElem;
	for (; it != it_end; it++, aux++)
		*aux = *it;
}